

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_fma.cpp
# Opt level: O0

void ncnn::layernorm(float *ptr,float *gamma_ptr,float *beta_ptr,float eps,int elemcount,
                    int elempack)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  int iVar33;
  int in_ECX;
  undefined1 (*in_RDX) [64];
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float in_XMM0_Da;
  float fVar39;
  float fVar41;
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  __m128 _p_17;
  __m256 _p_16;
  __m512 _p_15;
  int i_3;
  __m128 _beta_8;
  __m128 _gamma_8;
  __m128 _p_14;
  __m256 _beta_7;
  __m256 _gamma_7;
  __m256 _p_13;
  __m512 _beta_6;
  __m512 _gamma_6;
  __m512 _p_12;
  __m128 _beta_5;
  __m128 _gamma_5;
  __m128 _p_11;
  __m256 _beta_4;
  __m128 _beta1_2;
  __m128 _beta0_2;
  __m256 _gamma_4;
  __m128 _gamma1_2;
  __m128 _gamma0_2;
  __m256 _p_10;
  __m512 _beta_3;
  __m256 _beta23;
  __m256 _beta01;
  __m128 _beta3;
  __m128 _beta2;
  __m128 _beta1_1;
  __m128 _beta0_1;
  __m512 _gamma_3;
  __m256 _gamma23;
  __m256 _gamma01;
  __m128 _gamma3;
  __m128 _gamma2;
  __m128 _gamma1_1;
  __m128 _gamma0_1;
  __m512 _p_9;
  __m256 _beta_2;
  __m256 _gamma_2;
  __m256 _p_8;
  __m512 _beta_1;
  __m256 _beta1;
  __m256 _beta0;
  __m512 _gamma_1;
  __m256 _gamma1;
  __m256 _gamma0;
  __m512 _p_7;
  __m512 _beta;
  __m512 _gamma;
  __m512 _p_6;
  int i_2;
  __m128 _eps_2;
  __m128 _elemcount_5;
  __m128 _var1_3;
  __m128 _var0_3;
  __m256 _var1_2;
  __m256 _var0_2;
  __m256 _eps_1;
  __m256 _elemcount_4;
  __m256 _var1_1;
  __m256 _var0_1;
  __m256 _var1;
  __m256 _var0;
  __m512 _eps;
  __m512 _elemcount_3;
  float v;
  __m128 _p_5;
  __m256 _p_4;
  __m512 _p_3;
  int i_1;
  float *ptr0_1;
  float var;
  __m128 _var;
  __m256 _var_avx;
  __m512 _var_avx512;
  __m128 _elemcount_2;
  __m128 _mean1_2;
  __m128 _mean0_2;
  __m256 _mean1_1;
  __m256 _mean0_1;
  __m256 _elemcount_1;
  __m256 _mean1;
  __m256 _mean0;
  __m512 _elemcount;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr0;
  float mean;
  __m128 _mean;
  __m256 _mean_avx;
  __m512 _mean_avx512;
  int size;
  __m128 x32_3;
  __m128 x64_3;
  __m128 x128_2;
  __m256 x256_1;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  __m128 x32_4;
  __m128 x64_4;
  __m128 x128_3;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x128_1;
  __m128 x32_5;
  __m128 x64_5;
  __m128 x32_2;
  __m128 x64_2;
  undefined8 local_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 uStack_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  int local_3c14;
  undefined8 local_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 uStack_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3a70;
  undefined8 uStack_3a68;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 uStack_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 uStack_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 uStack_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  int local_3544;
  undefined8 local_3520;
  undefined8 uStack_3518;
  int local_32c4;
  undefined1 (*local_32c0) [64];
  float local_32b4;
  undefined1 local_32b0 [8];
  undefined8 uStack_32a8;
  undefined1 local_32a0 [8];
  undefined8 uStack_3298;
  undefined1 auStack_3290 [8];
  undefined8 uStack_3288;
  undefined1 local_3280 [64];
  undefined8 local_3200;
  undefined8 uStack_31f8;
  int local_3044;
  undefined1 (*local_3040) [64];
  float local_3034;
  undefined1 local_3030 [8];
  undefined8 uStack_3028;
  undefined1 local_3020 [8];
  undefined8 uStack_3018;
  undefined1 auStack_3010 [8];
  undefined8 uStack_3008;
  undefined1 local_3000 [64];
  undefined1 (*local_2f98) [64];
  undefined1 (*local_2f90) [64];
  undefined1 (*local_2f88) [64];
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  float fStack_27a4;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  float fStack_2744;
  float local_2740;
  float fStack_273c;
  float fStack_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  float fStack_2728;
  float fStack_2724;
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  float fStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float local_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float local_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  float fStack_1c44;
  float local_1c40;
  float fStack_1c3c;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  float local_1ac0;
  float fStack_1abc;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float local_19c0;
  float fStack_19bc;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float local_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  float local_1900;
  float fStack_18fc;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float local_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  float local_1870;
  float fStack_186c;
  float local_1860;
  float fStack_185c;
  float local_1820;
  float fStack_181c;
  float local_1810;
  float fStack_180c;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float local_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_690;
  undefined8 uStack_688;
  
  iVar33 = in_ECX * in_R8D;
  local_3000 = vbroadcastss_avx512f(ZEXT416(0));
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  _local_3020 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  uStack_910 = auVar5._0_8_;
  uStack_908 = auVar5._8_8_;
  auStack_3010 = (undefined1  [8])uStack_910;
  uStack_3008 = uStack_908;
  _local_3030 = ZEXT816(0);
  local_3034 = 0.0;
  local_3040 = in_RDI;
  for (local_3044 = 0; local_3044 + 0xf < iVar33; local_3044 = local_3044 + 0x10) {
    local_3000 = vaddps_avx512f(local_3000,*local_3040);
    local_3040 = local_3040 + 1;
  }
  while( true ) {
    local_2560 = local_3020._0_4_;
    fStack_255c = local_3020._4_4_;
    fStack_2558 = local_3020._8_4_;
    fStack_2554 = local_3020._12_4_;
    fStack_2550 = local_3020._16_4_;
    fStack_254c = local_3020._20_4_;
    fStack_2548 = local_3020._24_4_;
    fStack_2544 = local_3020._28_4_;
    if (iVar33 <= local_3044 + 7) break;
    local_2580 = (float)*(undefined8 *)*local_3040;
    fStack_257c = (float)((ulong)*(undefined8 *)*local_3040 >> 0x20);
    fStack_2578 = (float)*(undefined8 *)(*local_3040 + 8);
    fStack_2574 = (float)((ulong)*(undefined8 *)(*local_3040 + 8) >> 0x20);
    fStack_2570 = (float)*(undefined8 *)(*local_3040 + 0x10);
    fStack_256c = (float)((ulong)*(undefined8 *)(*local_3040 + 0x10) >> 0x20);
    fStack_2568 = (float)*(undefined8 *)(*local_3040 + 0x18);
    fStack_2564 = (float)((ulong)*(undefined8 *)(*local_3040 + 0x18) >> 0x20);
    local_3020._4_4_ = fStack_255c + fStack_257c;
    local_3020._0_4_ = local_2560 + local_2580;
    uStack_3018._0_4_ = fStack_2558 + fStack_2578;
    uStack_3018._4_4_ = fStack_2554 + fStack_2574;
    auStack_3010._0_4_ = fStack_2550 + fStack_2570;
    auStack_3010._4_4_ = fStack_254c + fStack_256c;
    uStack_3008._0_4_ = fStack_2548 + fStack_2568;
    uStack_3008._4_4_ = fStack_2544 + fStack_2564;
    local_3040 = (undefined1 (*) [64])(*local_3040 + 0x20);
    local_3044 = local_3044 + 8;
  }
  while( true ) {
    local_2450 = local_3030._0_4_;
    fStack_244c = local_3030._4_4_;
    fStack_2448 = local_3030._8_4_;
    fStack_2444 = local_3030._12_4_;
    if (iVar33 <= local_3044 + 3) break;
    local_2460 = (float)*(undefined8 *)*local_3040;
    fStack_245c = (float)((ulong)*(undefined8 *)*local_3040 >> 0x20);
    fStack_2458 = (float)*(undefined8 *)(*local_3040 + 8);
    fStack_2454 = (float)((ulong)*(undefined8 *)(*local_3040 + 8) >> 0x20);
    local_3030._4_4_ = fStack_244c + fStack_245c;
    local_3030._0_4_ = local_2450 + local_2460;
    uStack_3028._0_4_ = fStack_2448 + fStack_2458;
    uStack_3028._4_4_ = fStack_2444 + fStack_2454;
    local_3040 = (undefined1 (*) [64])(*local_3040 + 0x10);
    local_3044 = local_3044 + 4;
  }
  for (; local_3044 < iVar33; local_3044 = local_3044 + 1) {
    local_3034 = *(float *)*local_3040 + local_3034;
    local_3040 = (undefined1 (*) [64])(*local_3040 + 4);
  }
  if (in_R8D == 0x10) {
    auVar36 = vbroadcastss_avx512f(ZEXT416((uint)(float)in_ECX));
    local_3000 = vdivps_avx512f(local_3000,auVar36);
  }
  if (in_R8D == 8) {
    local_25c0 = local_3000._0_4_;
    fStack_25bc = local_3000._4_4_;
    fStack_25b8 = local_3000._8_4_;
    fStack_25b4 = local_3000._12_4_;
    fStack_25b0 = local_3000._16_4_;
    fStack_25ac = local_3000._20_4_;
    fStack_25a8 = local_3000._24_4_;
    fStack_25a4 = local_3000._28_4_;
    local_2600 = local_3000._32_4_;
    fStack_25fc = local_3000._36_4_;
    fStack_25f8 = local_3000._40_4_;
    fStack_25f4 = local_3000._44_4_;
    fStack_25f0 = local_3000._48_4_;
    fStack_25ec = local_3000._52_4_;
    fStack_25e8 = local_3000._56_4_;
    fStack_25e4 = local_3000._60_4_;
    local_3020._4_4_ = fStack_255c + fStack_25bc + fStack_25fc;
    local_3020._0_4_ = local_2560 + local_25c0 + local_2600;
    uStack_3018._0_4_ = fStack_2558 + fStack_25b8 + fStack_25f8;
    uStack_3018._4_4_ = fStack_2554 + fStack_25b4 + fStack_25f4;
    auStack_3010._0_4_ = fStack_2550 + fStack_25b0 + fStack_25f0;
    auStack_3010._4_4_ = fStack_254c + fStack_25ac + fStack_25ec;
    uStack_3008._0_4_ = fStack_2548 + fStack_25a8 + fStack_25e8;
    uStack_3008._4_4_ = fStack_2544 + fStack_25a4 + fStack_25e4;
    auVar34 = _local_3020;
    fVar39 = (float)in_ECX;
    auVar5 = vinsertps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar39),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar39),0x30);
    auVar6 = vinsertps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar39),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar39),0x30);
    uStack_8d0 = auVar6._0_8_;
    uStack_8c8 = auVar6._8_8_;
    uStack_3008 = auVar34._24_8_;
    auVar35._16_8_ = auStack_3010;
    auVar35._0_16_ = _local_3020;
    auVar35._24_8_ = uStack_3008;
    auVar34._16_8_ = uStack_8d0;
    auVar34._0_16_ = auVar5;
    auVar34._24_8_ = uStack_8c8;
    _local_3020 = vdivps_avx(auVar35,auVar34);
    local_3000 = vinsertf64x4_avx512f(ZEXT3264(_local_3020),_local_3020,1);
  }
  if (in_R8D == 4) {
    fStack_2610 = local_3020._16_4_;
    fStack_260c = local_3020._20_4_;
    fStack_2608 = local_3020._24_4_;
    fStack_2604 = local_3020._28_4_;
    fStack_2630 = local_3000._16_4_;
    fStack_262c = local_3000._20_4_;
    fStack_2628 = local_3000._24_4_;
    fStack_2624 = local_3000._28_4_;
    fStack_2670 = local_3000._48_4_;
    fStack_266c = local_3000._52_4_;
    fStack_2668 = local_3000._56_4_;
    fStack_2664 = local_3000._60_4_;
    local_24a0 = (float)local_3200;
    fStack_249c = (float)((ulong)local_3200 >> 0x20);
    fStack_2498 = (float)uStack_31f8;
    fStack_2494 = (float)((ulong)uStack_31f8 >> 0x20);
    local_3030._4_4_ = fStack_244c + fStack_260c + fStack_262c + fStack_266c + fStack_249c;
    local_3030._0_4_ = local_2450 + fStack_2610 + fStack_2630 + fStack_2670 + local_24a0;
    uStack_3028._0_4_ = fStack_2448 + fStack_2608 + fStack_2628 + fStack_2668 + fStack_2498;
    uStack_3028._4_4_ = fStack_2444 + fStack_2604 + fStack_2624 + fStack_2664 + fStack_2494;
    fVar39 = (float)in_ECX;
    auVar5._4_4_ = fVar39;
    auVar5._0_4_ = fVar39;
    auVar5._12_4_ = fVar39;
    auVar5._8_4_ = fVar39;
    auVar6._8_8_ = uStack_3028;
    auVar6._0_8_ = local_3030;
    _local_3030 = vdivps_avx(auVar6,auVar5);
    _auStack_3010 = _local_3030;
    _local_3020 = _local_3030;
    local_3000 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_3028,CONCAT816(local_3030,_local_3030))),
                            _local_3020,1);
  }
  if (in_R8D == 1) {
    auVar34 = vextractf64x4_avx512f(local_3000,1);
    fStack_1ad0 = local_3000._16_4_;
    fStack_1acc = local_3000._20_4_;
    fStack_1ac8 = local_3000._24_4_;
    fStack_1ac4 = local_3000._28_4_;
    fStack_1af0 = auVar34._16_4_;
    fStack_1aec = auVar34._20_4_;
    fStack_1ae8 = auVar34._24_4_;
    fStack_1ae4 = auVar34._28_4_;
    fVar39 = fStack_1ad0 + fStack_1af0 + local_1aa0;
    fVar41 = fStack_1acc + fStack_1aec + fStack_1a9c;
    uVar16 = CONCAT44(fVar41,fVar39);
    uVar17 = CONCAT44(fStack_1ac4 + fStack_1ae4 + fStack_1a94,
                      fStack_1ac8 + fStack_1ae8 + fStack_1a98);
    auVar24._8_8_ = uVar17;
    auVar24._0_8_ = uVar16;
    auVar23._8_8_ = uVar17;
    auVar23._0_8_ = uVar16;
    auVar5 = vunpckhpd_avx(auVar23,auVar24);
    local_1ac0 = auVar5._0_4_;
    fStack_1abc = auVar5._4_4_;
    local_18d0 = local_3020._16_4_;
    fStack_18cc = local_3020._20_4_;
    fStack_18c8 = local_3020._24_4_;
    fStack_18c4 = local_3020._28_4_;
    local_18e0 = local_3020._0_4_;
    fStack_18dc = local_3020._4_4_;
    fStack_18d8 = local_3020._8_4_;
    fStack_18d4 = local_3020._12_4_;
    uVar16 = CONCAT44(fStack_18cc + fStack_18dc,local_18d0 + local_18e0);
    uVar17 = CONCAT44(fStack_18c4 + fStack_18d4,fStack_18c8 + fStack_18d8);
    auVar20._8_8_ = uVar17;
    auVar20._0_8_ = uVar16;
    auVar7._8_8_ = uVar17;
    auVar7._0_8_ = uVar16;
    auVar5 = vunpckhpd_avx(auVar7,auVar20);
    local_1900 = auVar5._0_4_;
    fStack_18fc = auVar5._4_4_;
    auVar5 = vunpckhpd_avx(_local_3030,_local_3030);
    local_1810 = local_3030._0_4_;
    fStack_180c = local_3030._4_4_;
    local_1820 = auVar5._0_4_;
    fStack_181c = auVar5._4_4_;
    local_3034 = (local_3034 + fVar39 + local_1ac0 + fVar41 + fStack_1abc +
                  local_18d0 + local_18e0 + local_1900 + fStack_18cc + fStack_18dc + fStack_18fc +
                 local_1810 + local_1820 + fStack_180c + fStack_181c) / (float)in_ECX;
    local_3030 = (undefined1  [8])CONCAT44(local_3034,local_3034);
    uStack_3028 = CONCAT44(local_3034,local_3034);
    auStack_3010 = local_3030;
    uStack_3008 = uStack_3028;
    uStack_3018 = uStack_3028;
    local_3020 = local_3030;
    local_3000 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_3028,
                                               CONCAT816(local_3030,CONCAT88(uStack_3028,local_3030)
                                                        ))),_local_3020,1);
  }
  local_3280 = vbroadcastss_avx512f(ZEXT416(0));
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  _local_32a0 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  uStack_890 = auVar5._0_8_;
  uStack_888 = auVar5._8_8_;
  auStack_3290 = (undefined1  [8])uStack_890;
  uStack_3288 = uStack_888;
  _local_32b0 = ZEXT816(0);
  local_32b4 = 0.0;
  local_32c0 = in_RDI;
  for (local_32c4 = 0; local_32c4 + 0xf < iVar33; local_32c4 = local_32c4 + 0x10) {
    auVar36 = vsubps_avx512f(*local_32c0,local_3000);
    local_3280 = vfmadd213ps_avx512f(auVar36,auVar36,local_3280);
    local_32c0 = local_32c0 + 1;
  }
  for (; local_32c4 + 7 < iVar33; local_32c4 = local_32c4 + 8) {
    auVar34 = vsubps_avx(*(undefined1 (*) [32])*local_32c0,_local_3020);
    auVar5 = vfmadd213ps_fma(auVar34,auVar34,_local_32a0);
    _local_32a0 = ZEXT1632(auVar5);
    local_32c0 = (undefined1 (*) [64])(*local_32c0 + 0x20);
  }
  for (; local_32c4 + 3 < iVar33; local_32c4 = local_32c4 + 4) {
    auVar5 = vsubps_avx(*(undefined1 (*) [16])*local_32c0,_local_3030);
    _local_32b0 = vfmadd213ps_fma(auVar5,auVar5,_local_32b0);
    local_32c0 = (undefined1 (*) [64])(*local_32c0 + 0x10);
  }
  for (; local_32c4 < iVar33; local_32c4 = local_32c4 + 1) {
    fVar39 = *(float *)*local_32c0 - local_3034;
    local_32b4 = fVar39 * fVar39 + local_32b4;
    local_32c0 = (undefined1 (*) [64])(*local_32c0 + 4);
  }
  if (in_R8D == 0x10) {
    auVar36 = vbroadcastss_avx512f(ZEXT416((uint)(float)in_ECX));
    auVar37 = vbroadcastss_avx512f(ZEXT416((uint)in_XMM0_Da));
    auVar36 = vdivps_avx512f(local_3280,auVar36);
    auVar36 = vaddps_avx512f(auVar36,auVar37);
    auVar34 = vrsqrtps_avx(auVar36._0_32_);
    auVar35 = vextractf64x4_avx512f(auVar36,1);
    auVar35 = vrsqrtps_avx(auVar35);
    local_3280 = vinsertf64x4_avx512f(ZEXT3264(auVar34),auVar35,1);
    local_3000 = vmulps_avx512f(local_3000,local_3280);
  }
  if (in_R8D == 8) {
    local_26a0 = local_32a0._0_4_;
    fStack_269c = local_32a0._4_4_;
    fStack_2698 = local_32a0._8_4_;
    fStack_2694 = local_32a0._12_4_;
    fStack_2690 = local_32a0._16_4_;
    fStack_268c = local_32a0._20_4_;
    fStack_2688 = local_32a0._24_4_;
    fStack_2684 = local_32a0._28_4_;
    local_26c0 = local_3280._0_4_;
    fStack_26bc = local_3280._4_4_;
    fStack_26b8 = local_3280._8_4_;
    fStack_26b4 = local_3280._12_4_;
    fStack_26b0 = local_3280._16_4_;
    fStack_26ac = local_3280._20_4_;
    fStack_26a8 = local_3280._24_4_;
    fStack_26a4 = local_3280._28_4_;
    local_2700 = local_3280._32_4_;
    fStack_26fc = local_3280._36_4_;
    fStack_26f8 = local_3280._40_4_;
    fStack_26f4 = local_3280._44_4_;
    fStack_26f0 = local_3280._48_4_;
    fStack_26ec = local_3280._52_4_;
    fStack_26e8 = local_3280._56_4_;
    fStack_26e4 = local_3280._60_4_;
    local_32a0._4_4_ = fStack_269c + fStack_26bc + fStack_26fc;
    local_32a0._0_4_ = local_26a0 + local_26c0 + local_2700;
    uStack_3298._0_4_ = fStack_2698 + fStack_26b8 + fStack_26f8;
    uStack_3298._4_4_ = fStack_2694 + fStack_26b4 + fStack_26f4;
    auStack_3290._0_4_ = fStack_2690 + fStack_26b0 + fStack_26f0;
    auStack_3290._4_4_ = fStack_268c + fStack_26ac + fStack_26ec;
    uStack_3288._0_4_ = fStack_2688 + fStack_26a8 + fStack_26e8;
    uStack_3288._4_4_ = fStack_2684 + fStack_26a4 + fStack_26e4;
    auVar34 = _local_32a0;
    fVar39 = (float)in_ECX;
    auVar5 = vinsertps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar39),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar39),0x30);
    auVar6 = vinsertps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar39),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar39),0x30);
    uStack_850 = auVar6._0_8_;
    uStack_848 = auVar6._8_8_;
    auVar6 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)in_XMM0_Da),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)in_XMM0_Da),0x30);
    auVar7 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)in_XMM0_Da),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)in_XMM0_Da),0x30);
    uStack_3288 = auVar34._24_8_;
    auVar13._16_8_ = auStack_3290;
    auVar13._0_16_ = _local_32a0;
    auVar13._24_8_ = uStack_3288;
    auVar12._16_8_ = uStack_850;
    auVar12._0_16_ = auVar5;
    auVar12._24_8_ = uStack_848;
    auVar34 = vdivps_avx(auVar13,auVar12);
    local_2720 = auVar34._0_4_;
    fStack_271c = auVar34._4_4_;
    fStack_2718 = auVar34._8_4_;
    fStack_2714 = auVar34._12_4_;
    fStack_2710 = auVar34._16_4_;
    fStack_270c = auVar34._20_4_;
    fStack_2708 = auVar34._24_4_;
    fStack_2704 = auVar34._28_4_;
    local_2740 = auVar6._0_4_;
    fStack_273c = auVar6._4_4_;
    fStack_2738 = auVar6._8_4_;
    fStack_2734 = auVar6._12_4_;
    fStack_2730 = auVar7._0_4_;
    fStack_272c = auVar7._4_4_;
    fStack_2728 = auVar7._8_4_;
    fStack_2724 = auVar7._12_4_;
    local_32a0._4_4_ = fStack_271c + fStack_273c;
    local_32a0._0_4_ = local_2720 + local_2740;
    uStack_3298._0_4_ = fStack_2718 + fStack_2738;
    uStack_3298._4_4_ = fStack_2714 + fStack_2734;
    auStack_3290._0_4_ = fStack_2710 + fStack_2730;
    auStack_3290._4_4_ = fStack_270c + fStack_272c;
    uStack_3288._0_4_ = fStack_2708 + fStack_2728;
    uStack_3288._4_4_ = fStack_2704 + fStack_2724;
    auVar34 = _local_32a0;
    uStack_3288 = auVar34._24_8_;
    auVar18._16_8_ = auStack_3290;
    auVar18._0_16_ = _local_32a0;
    auVar18._24_8_ = uStack_3288;
    _local_32a0 = vrsqrtps_avx(auVar18);
    local_11a0 = local_3020._0_4_;
    fStack_119c = local_3020._4_4_;
    fStack_1198 = local_3020._8_4_;
    fStack_1194 = local_3020._12_4_;
    fStack_1190 = local_3020._16_4_;
    fStack_118c = local_3020._20_4_;
    fStack_1188 = local_3020._24_4_;
    uStack_1184 = local_3020._28_4_;
    local_11c0 = local_32a0._0_4_;
    fStack_11bc = local_32a0._4_4_;
    fStack_11b8 = local_32a0._8_4_;
    fStack_11b4 = local_32a0._12_4_;
    fStack_11b0 = local_32a0._16_4_;
    fStack_11ac = local_32a0._20_4_;
    fStack_11a8 = local_32a0._24_4_;
    local_3020._4_4_ = fStack_119c * fStack_11bc;
    local_3020._0_4_ = local_11a0 * local_11c0;
    uStack_3018._0_4_ = fStack_1198 * fStack_11b8;
    uStack_3018._4_4_ = fStack_1194 * fStack_11b4;
    auStack_3010._0_4_ = fStack_1190 * fStack_11b0;
    auStack_3010._4_4_ = fStack_118c * fStack_11ac;
    uStack_3008._0_4_ = fStack_1188 * fStack_11a8;
    uStack_3008._4_4_ = uStack_1184;
    auVar34 = _local_3020;
    local_3280 = vinsertf64x4_avx512f(ZEXT3264(_local_32a0),_local_32a0,1);
    uStack_3008 = auVar34._24_8_;
    local_3000 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_3008,CONCAT816(auStack_3010,_local_3020))),
                            auVar34,1);
    _local_3020 = auVar34;
  }
  if (in_R8D == 4) {
    fStack_2750 = local_32a0._16_4_;
    fStack_274c = local_32a0._20_4_;
    fStack_2748 = local_32a0._24_4_;
    fStack_2744 = local_32a0._28_4_;
    fStack_2770 = local_3280._16_4_;
    fStack_276c = local_3280._20_4_;
    fStack_2768 = local_3280._24_4_;
    fStack_2764 = local_3280._28_4_;
    fStack_27b0 = local_3280._48_4_;
    fStack_27ac = local_3280._52_4_;
    fStack_27a8 = local_3280._56_4_;
    fStack_27a4 = local_3280._60_4_;
    local_24b0 = local_32b0._0_4_;
    fStack_24ac = local_32b0._4_4_;
    fStack_24a8 = local_32b0._8_4_;
    fStack_24a4 = local_32b0._12_4_;
    local_24e0 = (float)local_3520;
    fStack_24dc = (float)((ulong)local_3520 >> 0x20);
    fStack_24d8 = (float)uStack_3518;
    fStack_24d4 = (float)((ulong)uStack_3518 >> 0x20);
    local_32b0._4_4_ = fStack_24ac + fStack_274c + fStack_276c + fStack_27ac + fStack_24dc;
    local_32b0._0_4_ = local_24b0 + fStack_2750 + fStack_2770 + fStack_27b0 + local_24e0;
    uStack_32a8._0_4_ = fStack_24a8 + fStack_2748 + fStack_2768 + fStack_27a8 + fStack_24d8;
    uStack_32a8._4_4_ = fStack_24a4 + fStack_2744 + fStack_2764 + fStack_27a4 + fStack_24d4;
    fVar39 = (float)in_ECX;
    auVar14._4_4_ = fVar39;
    auVar14._0_4_ = fVar39;
    auVar14._12_4_ = fVar39;
    auVar14._8_4_ = fVar39;
    auVar15._8_8_ = uStack_32a8;
    auVar15._0_8_ = local_32b0;
    auVar5 = vdivps_avx(auVar15,auVar14);
    local_24f0 = auVar5._0_4_;
    fStack_24ec = auVar5._4_4_;
    fStack_24e8 = auVar5._8_4_;
    fStack_24e4 = auVar5._12_4_;
    local_32b0._4_4_ = fStack_24ec + in_XMM0_Da;
    local_32b0._0_4_ = local_24f0 + in_XMM0_Da;
    uStack_32a8._0_4_ = fStack_24e8 + in_XMM0_Da;
    uStack_32a8._4_4_ = fStack_24e4 + in_XMM0_Da;
    auVar19._8_8_ = uStack_32a8;
    auVar19._0_8_ = local_32b0;
    _local_32b0 = vrsqrtps_avx(auVar19);
    local_1150 = local_3030._0_4_;
    fStack_114c = local_3030._4_4_;
    fStack_1148 = local_3030._8_4_;
    fStack_1144 = local_3030._12_4_;
    local_1160 = local_32b0._0_4_;
    fStack_115c = local_32b0._4_4_;
    fStack_1158 = local_32b0._8_4_;
    fStack_1154 = local_32b0._12_4_;
    local_3030._4_4_ = fStack_114c * fStack_115c;
    local_3030._0_4_ = local_1150 * local_1160;
    uStack_3028._0_4_ = fStack_1148 * fStack_1158;
    uStack_3028._4_4_ = fStack_1144 * fStack_1154;
    _auStack_3290 = _local_32b0;
    _local_32a0 = _local_32b0;
    auStack_3010 = local_3030;
    uStack_3008 = uStack_3028;
    uStack_3018 = uStack_3028;
    local_3020 = local_3030;
    local_3280 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_32a8,CONCAT816(local_32b0,_local_32b0))),
                            _local_32a0,1);
    local_3000 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_3028,
                                               CONCAT816(local_3030,CONCAT88(uStack_3028,local_3030)
                                                        ))),_local_3020,1);
  }
  if (in_R8D == 1) {
    auVar34 = vextractf64x4_avx512f(local_3280,1);
    fStack_1c50 = local_3280._16_4_;
    fStack_1c4c = local_3280._20_4_;
    fStack_1c48 = local_3280._24_4_;
    fStack_1c44 = local_3280._28_4_;
    fStack_1c70 = auVar34._16_4_;
    fStack_1c6c = auVar34._20_4_;
    fStack_1c68 = auVar34._24_4_;
    fStack_1c64 = auVar34._28_4_;
    fVar39 = fStack_1c50 + fStack_1c70 + local_1c20;
    fVar41 = fStack_1c4c + fStack_1c6c + fStack_1c1c;
    uVar16 = CONCAT44(fVar41,fVar39);
    uVar17 = CONCAT44(fStack_1c44 + fStack_1c64 + fStack_1c14,
                      fStack_1c48 + fStack_1c68 + fStack_1c18);
    auVar26._8_8_ = uVar17;
    auVar26._0_8_ = uVar16;
    auVar25._8_8_ = uVar17;
    auVar25._0_8_ = uVar16;
    auVar5 = vunpckhpd_avx(auVar25,auVar26);
    local_1c40 = auVar5._0_4_;
    fStack_1c3c = auVar5._4_4_;
    local_1990 = local_32a0._16_4_;
    fStack_198c = local_32a0._20_4_;
    fStack_1988 = local_32a0._24_4_;
    fStack_1984 = local_32a0._28_4_;
    local_19a0 = local_32a0._0_4_;
    fStack_199c = local_32a0._4_4_;
    fStack_1998 = local_32a0._8_4_;
    fStack_1994 = local_32a0._12_4_;
    uVar16 = CONCAT44(fStack_198c + fStack_199c,local_1990 + local_19a0);
    uVar17 = CONCAT44(fStack_1984 + fStack_1994,fStack_1988 + fStack_1998);
    auVar22._8_8_ = uVar17;
    auVar22._0_8_ = uVar16;
    auVar21._8_8_ = uVar17;
    auVar21._0_8_ = uVar16;
    auVar5 = vunpckhpd_avx(auVar21,auVar22);
    local_19c0 = auVar5._0_4_;
    fStack_19bc = auVar5._4_4_;
    auVar5 = vunpckhpd_avx(_local_32b0,_local_32b0);
    local_1860 = local_32b0._0_4_;
    fStack_185c = local_32b0._4_4_;
    local_1870 = auVar5._0_4_;
    fStack_186c = auVar5._4_4_;
    auVar40._0_4_ =
         (local_32b4 + fVar39 + local_1c40 + fVar41 + fStack_1c3c +
          local_1990 + local_19a0 + local_19c0 + fStack_198c + fStack_199c + fStack_19bc +
         local_1860 + local_1870 + fStack_185c + fStack_186c) / (float)in_ECX;
    auVar40._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar5 = vsqrtss_avx(auVar40,ZEXT416((uint)(auVar40._0_4_ + in_XMM0_Da)));
    local_32b4 = 1.0 / auVar5._0_4_;
    local_3034 = local_3034 * local_32b4;
    local_32b0 = (undefined1  [8])CONCAT44(local_32b4,local_32b4);
    uStack_32a8 = CONCAT44(local_32b4,local_32b4);
    local_3030 = (undefined1  [8])CONCAT44(local_3034,local_3034);
    uStack_3028 = CONCAT44(local_3034,local_3034);
    auStack_3290 = local_32b0;
    uStack_3288 = uStack_32a8;
    uStack_3298 = uStack_32a8;
    local_32a0 = local_32b0;
    auStack_3010 = local_3030;
    uStack_3008 = uStack_3028;
    uStack_3018 = uStack_3028;
    local_3020 = local_3030;
    local_3280 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_32a8,
                                               CONCAT816(local_32b0,CONCAT88(uStack_32a8,local_32b0)
                                                        ))),_local_32a0,1);
    local_3000 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_3028,
                                               CONCAT816(local_3030,CONCAT88(uStack_3028,local_3030)
                                                        ))),_local_3020,1);
  }
  local_2f88 = in_RDI;
  if ((in_RSI == (undefined1 (*) [64])0x0) || (in_RDX == (undefined1 (*) [64])0x0)) {
    for (local_3c14 = 0; local_3c14 + 0xf < iVar33; local_3c14 = local_3c14 + 0x10) {
      auVar36 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar36 = vpxord_avx512f(local_3000,auVar36);
      auVar36 = vfmadd213ps_avx512f(local_3280,*local_2f88,auVar36);
      local_3c80 = auVar36._0_8_;
      uStack_3c78 = auVar36._8_8_;
      uStack_3c70 = auVar36._16_8_;
      uStack_3c68 = auVar36._24_8_;
      uStack_3c60 = auVar36._32_8_;
      uStack_3c58 = auVar36._40_8_;
      uStack_3c50 = auVar36._48_8_;
      uStack_3c48 = auVar36._56_8_;
      *(undefined8 *)*local_2f88 = local_3c80;
      *(undefined8 *)(*local_2f88 + 8) = uStack_3c78;
      *(undefined8 *)(*local_2f88 + 0x10) = uStack_3c70;
      *(undefined8 *)(*local_2f88 + 0x18) = uStack_3c68;
      *(undefined8 *)(*local_2f88 + 0x20) = uStack_3c60;
      *(undefined8 *)(*local_2f88 + 0x28) = uStack_3c58;
      *(undefined8 *)(*local_2f88 + 0x30) = uStack_3c50;
      *(undefined8 *)(*local_2f88 + 0x38) = uStack_3c48;
      local_2f88 = local_2f88 + 1;
    }
    for (; local_3c14 + 7 < iVar33; local_3c14 = local_3c14 + 8) {
      auVar48._8_4_ = 0x80000000;
      auVar48._0_8_ = 0x8000000080000000;
      auVar48._12_4_ = 0x80000000;
      auVar48._16_4_ = 0x80000000;
      auVar48._20_4_ = 0x80000000;
      auVar48._24_4_ = 0x80000000;
      auVar48._28_4_ = 0x80000000;
      auVar5 = vfmadd213ps_fma(_local_32a0,*(undefined1 (*) [32])*local_2f88,_local_3020 ^ auVar48);
      local_3ca0 = auVar5._0_8_;
      uStack_3c98 = auVar5._8_8_;
      *(undefined8 *)*local_2f88 = local_3ca0;
      *(undefined8 *)(*local_2f88 + 8) = uStack_3c98;
      *(undefined8 *)(*local_2f88 + 0x10) = 0;
      *(undefined8 *)(*local_2f88 + 0x18) = 0;
      local_2f88 = (undefined1 (*) [64])(*local_2f88 + 0x20);
    }
    for (; local_3c14 + 3 < iVar33; local_3c14 = local_3c14 + 4) {
      auVar44._8_4_ = 0x80000000;
      auVar44._0_8_ = 0x8000000080000000;
      auVar44._12_4_ = 0x80000000;
      auVar5 = vfmadd213ps_fma(_local_32b0,*(undefined1 (*) [16])*local_2f88,_local_3030 ^ auVar44);
      local_3cb0 = auVar5._0_8_;
      uStack_3ca8 = auVar5._8_8_;
      *(undefined8 *)*local_2f88 = local_3cb0;
      *(undefined8 *)(*local_2f88 + 8) = uStack_3ca8;
      local_2f88 = (undefined1 (*) [64])(*local_2f88 + 0x10);
    }
    for (; local_3c14 < iVar33; local_3c14 = local_3c14 + 1) {
      *(float *)*local_2f88 = *(float *)*local_2f88 * local_32b4 - local_3034;
      local_2f88 = (undefined1 (*) [64])(*local_2f88 + 4);
    }
  }
  else {
    local_3544 = 0;
    local_2f98 = in_RDX;
    local_2f90 = in_RSI;
    if (in_R8D == 0x10) {
      for (; local_3544 + 0xf < iVar33; local_3544 = local_3544 + 0x10) {
        auVar36 = vbroadcastss_avx512f(ZEXT416(*(uint *)*local_2f90));
        auVar37 = vbroadcastss_avx512f(ZEXT416(*(uint *)*local_2f98));
        auVar38 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar38 = vpxord_avx512f(local_3000,auVar38);
        auVar38 = vfmadd213ps_avx512f(local_3280,*local_2f88,auVar38);
        auVar36 = vfmadd213ps_avx512f(auVar36,auVar38,auVar37);
        local_35c0 = auVar36._0_8_;
        uStack_35b8 = auVar36._8_8_;
        uStack_35b0 = auVar36._16_8_;
        uStack_35a8 = auVar36._24_8_;
        uStack_35a0 = auVar36._32_8_;
        uStack_3598 = auVar36._40_8_;
        uStack_3590 = auVar36._48_8_;
        uStack_3588 = auVar36._56_8_;
        *(undefined8 *)*local_2f88 = local_35c0;
        *(undefined8 *)(*local_2f88 + 8) = uStack_35b8;
        *(undefined8 *)(*local_2f88 + 0x10) = uStack_35b0;
        *(undefined8 *)(*local_2f88 + 0x18) = uStack_35a8;
        *(undefined8 *)(*local_2f88 + 0x20) = uStack_35a0;
        *(undefined8 *)(*local_2f88 + 0x28) = uStack_3598;
        *(undefined8 *)(*local_2f88 + 0x30) = uStack_3590;
        *(undefined8 *)(*local_2f88 + 0x38) = uStack_3588;
        local_2f88 = local_2f88 + 1;
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 4);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 4);
      }
    }
    if (in_R8D == 8) {
      for (; local_3544 + 0xf < iVar33; local_3544 = local_3544 + 0x10) {
        uVar1 = *(uint *)*local_2f90;
        auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        uStack_7d0 = auVar6._0_8_;
        uStack_7c8 = auVar6._8_8_;
        uVar1 = *(uint *)(*local_2f90 + 4);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
        uStack_790 = auVar7._0_8_;
        uStack_788 = auVar7._8_8_;
        auVar11._16_8_ = uStack_790;
        auVar11._0_16_ = auVar6;
        auVar11._24_8_ = uStack_788;
        auVar36 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824(uStack_7c8,CONCAT816(uStack_7d0,auVar5))),auVar11,1)
        ;
        uVar1 = *(uint *)*local_2f98;
        auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        uStack_750 = auVar6._0_8_;
        uStack_748 = auVar6._8_8_;
        uVar1 = *(uint *)(*local_2f98 + 4);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
        uStack_710 = auVar7._0_8_;
        uStack_708 = auVar7._8_8_;
        auVar10._16_8_ = uStack_710;
        auVar10._0_16_ = auVar6;
        auVar10._24_8_ = uStack_708;
        auVar37 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824(uStack_748,CONCAT816(uStack_750,auVar5))),auVar10,1)
        ;
        auVar38 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar38 = vpxord_avx512f(local_3000,auVar38);
        auVar38 = vfmadd213ps_avx512f(local_3280,*local_2f88,auVar38);
        auVar36 = vfmadd213ps_avx512f(auVar36,auVar38,auVar37);
        local_3680 = auVar36._0_8_;
        uStack_3678 = auVar36._8_8_;
        uStack_3670 = auVar36._16_8_;
        uStack_3668 = auVar36._24_8_;
        uStack_3660 = auVar36._32_8_;
        uStack_3658 = auVar36._40_8_;
        uStack_3650 = auVar36._48_8_;
        uStack_3648 = auVar36._56_8_;
        *(undefined8 *)*local_2f88 = local_3680;
        *(undefined8 *)(*local_2f88 + 8) = uStack_3678;
        *(undefined8 *)(*local_2f88 + 0x10) = uStack_3670;
        *(undefined8 *)(*local_2f88 + 0x18) = uStack_3668;
        *(undefined8 *)(*local_2f88 + 0x20) = uStack_3660;
        *(undefined8 *)(*local_2f88 + 0x28) = uStack_3658;
        *(undefined8 *)(*local_2f88 + 0x30) = uStack_3650;
        *(undefined8 *)(*local_2f88 + 0x38) = uStack_3648;
        local_2f88 = local_2f88 + 1;
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 8);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 8);
      }
      for (; local_3544 + 7 < iVar33; local_3544 = local_3544 + 8) {
        uVar1 = *(uint *)*local_2f90;
        auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        uStack_6d0 = auVar6._0_8_;
        uStack_6c8 = auVar6._8_8_;
        uVar1 = *(uint *)*local_2f98;
        auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
        auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
        uStack_690 = auVar7._0_8_;
        uStack_688 = auVar7._8_8_;
        auVar45._8_4_ = 0x80000000;
        auVar45._0_8_ = 0x8000000080000000;
        auVar45._12_4_ = 0x80000000;
        auVar45._16_4_ = 0x80000000;
        auVar45._20_4_ = 0x80000000;
        auVar45._24_4_ = 0x80000000;
        auVar45._28_4_ = 0x80000000;
        auVar7 = vfmadd213ps_fma(_local_32a0,*(undefined1 (*) [32])*local_2f88,_local_3020 ^ auVar45
                                );
        auVar32._16_8_ = uStack_6d0;
        auVar32._0_16_ = auVar5;
        auVar32._24_8_ = uStack_6c8;
        auVar31._16_8_ = uStack_690;
        auVar31._0_16_ = auVar6;
        auVar31._24_8_ = uStack_688;
        auVar5 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar7),auVar31);
        local_37a0 = auVar5._0_8_;
        uStack_3798 = auVar5._8_8_;
        *(undefined8 *)*local_2f88 = local_37a0;
        *(undefined8 *)(*local_2f88 + 8) = uStack_3798;
        *(undefined8 *)(*local_2f88 + 0x10) = 0;
        *(undefined8 *)(*local_2f88 + 0x18) = 0;
        local_2f88 = (undefined1 (*) [64])(*local_2f88 + 0x20);
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 4);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 4);
      }
    }
    if (in_R8D == 4) {
      for (; local_3544 + 0xf < iVar33; local_3544 = local_3544 + 0x10) {
        uVar2 = *(undefined4 *)*local_2f90;
        uVar3 = *(undefined4 *)(*local_2f90 + 4);
        uVar4 = *(undefined4 *)(*local_2f90 + 8);
        auVar9._4_4_ = uVar4;
        auVar9._0_4_ = uVar4;
        auVar9._12_4_ = uVar4;
        auVar9._8_4_ = uVar4;
        uVar4 = *(undefined4 *)(*local_2f90 + 0xc);
        auVar9._20_4_ = uVar4;
        auVar9._16_4_ = uVar4;
        auVar9._28_4_ = uVar4;
        auVar9._24_4_ = uVar4;
        auVar36 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824(CONCAT44(uVar3,uVar3),
                                                CONCAT816(CONCAT44(uVar3,uVar3),
                                                          CONCAT88(CONCAT44(uVar2,uVar2),
                                                                   CONCAT44(uVar2,uVar2))))),auVar9,
                             1);
        uVar2 = *(undefined4 *)*local_2f98;
        uVar3 = *(undefined4 *)(*local_2f98 + 4);
        uVar4 = *(undefined4 *)(*local_2f98 + 8);
        auVar8._4_4_ = uVar4;
        auVar8._0_4_ = uVar4;
        auVar8._12_4_ = uVar4;
        auVar8._8_4_ = uVar4;
        uVar4 = *(undefined4 *)(*local_2f98 + 0xc);
        auVar8._20_4_ = uVar4;
        auVar8._16_4_ = uVar4;
        auVar8._28_4_ = uVar4;
        auVar8._24_4_ = uVar4;
        auVar37 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824(CONCAT44(uVar3,uVar3),
                                                CONCAT816(CONCAT44(uVar3,uVar3),
                                                          CONCAT88(CONCAT44(uVar2,uVar2),
                                                                   CONCAT44(uVar2,uVar2))))),auVar8,
                             1);
        auVar38 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar38 = vpxord_avx512f(local_3000,auVar38);
        auVar38 = vfmadd213ps_avx512f(local_3280,*local_2f88,auVar38);
        auVar36 = vfmadd213ps_avx512f(auVar36,auVar38,auVar37);
        local_3840 = auVar36._0_8_;
        uStack_3838 = auVar36._8_8_;
        uStack_3830 = auVar36._16_8_;
        uStack_3828 = auVar36._24_8_;
        uStack_3820 = auVar36._32_8_;
        uStack_3818 = auVar36._40_8_;
        uStack_3810 = auVar36._48_8_;
        uStack_3808 = auVar36._56_8_;
        *(undefined8 *)*local_2f88 = local_3840;
        *(undefined8 *)(*local_2f88 + 8) = uStack_3838;
        *(undefined8 *)(*local_2f88 + 0x10) = uStack_3830;
        *(undefined8 *)(*local_2f88 + 0x18) = uStack_3828;
        *(undefined8 *)(*local_2f88 + 0x20) = uStack_3820;
        *(undefined8 *)(*local_2f88 + 0x28) = uStack_3818;
        *(undefined8 *)(*local_2f88 + 0x30) = uStack_3810;
        *(undefined8 *)(*local_2f88 + 0x38) = uStack_3808;
        local_2f88 = local_2f88 + 1;
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 0x10);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 0x10);
      }
      for (; local_3544 + 7 < iVar33; local_3544 = local_3544 + 8) {
        uVar2 = *(undefined4 *)*local_2f90;
        auVar30._4_4_ = uVar2;
        auVar30._0_4_ = uVar2;
        auVar30._12_4_ = uVar2;
        auVar30._8_4_ = uVar2;
        uVar2 = *(undefined4 *)(*local_2f90 + 4);
        auVar30._20_4_ = uVar2;
        auVar30._16_4_ = uVar2;
        auVar30._28_4_ = uVar2;
        auVar30._24_4_ = uVar2;
        uVar2 = *(undefined4 *)*local_2f98;
        auVar29._4_4_ = uVar2;
        auVar29._0_4_ = uVar2;
        auVar29._12_4_ = uVar2;
        auVar29._8_4_ = uVar2;
        uVar2 = *(undefined4 *)(*local_2f98 + 4);
        auVar29._20_4_ = uVar2;
        auVar29._16_4_ = uVar2;
        auVar29._28_4_ = uVar2;
        auVar29._24_4_ = uVar2;
        auVar46._8_4_ = 0x80000000;
        auVar46._0_8_ = 0x8000000080000000;
        auVar46._12_4_ = 0x80000000;
        auVar46._16_4_ = 0x80000000;
        auVar46._20_4_ = 0x80000000;
        auVar46._24_4_ = 0x80000000;
        auVar46._28_4_ = 0x80000000;
        auVar5 = vfmadd213ps_fma(_local_32a0,*(undefined1 (*) [32])*local_2f88,_local_3020 ^ auVar46
                                );
        auVar5 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar5),auVar29);
        local_39e0 = auVar5._0_8_;
        uStack_39d8 = auVar5._8_8_;
        *(undefined8 *)*local_2f88 = local_39e0;
        *(undefined8 *)(*local_2f88 + 8) = uStack_39d8;
        *(undefined8 *)(*local_2f88 + 0x10) = 0;
        *(undefined8 *)(*local_2f88 + 0x18) = 0;
        local_2f88 = (undefined1 (*) [64])(*local_2f88 + 0x20);
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 8);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 8);
      }
      for (; local_3544 + 3 < iVar33; local_3544 = local_3544 + 4) {
        uVar2 = *(undefined4 *)*local_2f90;
        auVar28._4_4_ = uVar2;
        auVar28._0_4_ = uVar2;
        auVar28._12_4_ = uVar2;
        auVar28._8_4_ = uVar2;
        uVar2 = *(undefined4 *)*local_2f98;
        auVar27._4_4_ = uVar2;
        auVar27._0_4_ = uVar2;
        auVar27._12_4_ = uVar2;
        auVar27._8_4_ = uVar2;
        auVar42._8_4_ = 0x80000000;
        auVar42._0_8_ = 0x8000000080000000;
        auVar42._12_4_ = 0x80000000;
        auVar5 = vfmadd213ps_fma(_local_32b0,*(undefined1 (*) [16])*local_2f88,_local_3030 ^ auVar42
                                );
        auVar5 = vfmadd213ps_fma(auVar28,auVar5,auVar27);
        local_3a70 = auVar5._0_8_;
        uStack_3a68 = auVar5._8_8_;
        *(undefined8 *)*local_2f88 = local_3a70;
        *(undefined8 *)(*local_2f88 + 8) = uStack_3a68;
        local_2f88 = (undefined1 (*) [64])(*local_2f88 + 0x10);
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 4);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 4);
      }
    }
    if (in_R8D == 1) {
      for (; local_3544 + 0xf < iVar33; local_3544 = local_3544 + 0x10) {
        auVar36 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar36 = vpxord_avx512f(local_3000,auVar36);
        auVar36 = vfmadd213ps_avx512f(local_3280,*local_2f88,auVar36);
        auVar36 = vfmadd213ps_avx512f(*local_2f90,auVar36,*local_2f98);
        local_3b00 = auVar36._0_8_;
        uStack_3af8 = auVar36._8_8_;
        uStack_3af0 = auVar36._16_8_;
        uStack_3ae8 = auVar36._24_8_;
        uStack_3ae0 = auVar36._32_8_;
        uStack_3ad8 = auVar36._40_8_;
        uStack_3ad0 = auVar36._48_8_;
        uStack_3ac8 = auVar36._56_8_;
        *(undefined8 *)*local_2f88 = local_3b00;
        *(undefined8 *)(*local_2f88 + 8) = uStack_3af8;
        *(undefined8 *)(*local_2f88 + 0x10) = uStack_3af0;
        *(undefined8 *)(*local_2f88 + 0x18) = uStack_3ae8;
        *(undefined8 *)(*local_2f88 + 0x20) = uStack_3ae0;
        *(undefined8 *)(*local_2f88 + 0x28) = uStack_3ad8;
        *(undefined8 *)(*local_2f88 + 0x30) = uStack_3ad0;
        *(undefined8 *)(*local_2f88 + 0x38) = uStack_3ac8;
        local_2f88 = local_2f88 + 1;
        local_2f90 = local_2f90 + 1;
        local_2f98 = local_2f98 + 1;
      }
      for (; local_3544 + 7 < iVar33; local_3544 = local_3544 + 8) {
        auVar47._8_4_ = 0x80000000;
        auVar47._0_8_ = 0x8000000080000000;
        auVar47._12_4_ = 0x80000000;
        auVar47._16_4_ = 0x80000000;
        auVar47._20_4_ = 0x80000000;
        auVar47._24_4_ = 0x80000000;
        auVar47._28_4_ = 0x80000000;
        auVar5 = vfmadd213ps_fma(_local_32a0,*(undefined1 (*) [32])*local_2f88,_local_3020 ^ auVar47
                                );
        auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])*local_2f90,ZEXT1632(auVar5),
                                 *(undefined1 (*) [32])*local_2f98);
        local_3ba0 = auVar5._0_8_;
        uStack_3b98 = auVar5._8_8_;
        *(undefined8 *)*local_2f88 = local_3ba0;
        *(undefined8 *)(*local_2f88 + 8) = uStack_3b98;
        *(undefined8 *)(*local_2f88 + 0x10) = 0;
        *(undefined8 *)(*local_2f88 + 0x18) = 0;
        local_2f88 = (undefined1 (*) [64])(*local_2f88 + 0x20);
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 0x20);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 0x20);
      }
      for (; local_3544 + 3 < iVar33; local_3544 = local_3544 + 4) {
        auVar43._8_4_ = 0x80000000;
        auVar43._0_8_ = 0x8000000080000000;
        auVar43._12_4_ = 0x80000000;
        auVar5 = vfmadd213ps_fma(_local_32b0,*(undefined1 (*) [16])*local_2f88,_local_3030 ^ auVar43
                                );
        auVar5 = vfmadd213ps_fma(*(undefined1 (*) [16])*local_2f90,auVar5,
                                 *(undefined1 (*) [16])*local_2f98);
        local_3bf0 = auVar5._0_8_;
        uStack_3be8 = auVar5._8_8_;
        *(undefined8 *)*local_2f88 = local_3bf0;
        *(undefined8 *)(*local_2f88 + 8) = uStack_3be8;
        local_2f88 = (undefined1 (*) [64])(*local_2f88 + 0x10);
        local_2f90 = (undefined1 (*) [64])(*local_2f90 + 0x10);
        local_2f98 = (undefined1 (*) [64])(*local_2f98 + 0x10);
      }
    }
    for (; local_3544 < iVar33; local_3544 = local_3544 + 1) {
      *(float *)*local_2f88 =
           (*(float *)*local_2f88 * local_32b4 - local_3034) * *(float *)*local_2f90 +
           *(float *)*local_2f98;
      local_2f88 = (undefined1 (*) [64])(*local_2f88 + 4);
      local_2f90 = (undefined1 (*) [64])(*local_2f90 + 4);
      local_2f98 = (undefined1 (*) [64])(*local_2f98 + 4);
    }
  }
  return;
}

Assistant:

static void layernorm(float* ptr, const float* gamma_ptr, const float* beta_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _mean_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _mean_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _mean = _mm_set1_ps(0.f);
#endif // __SSE2__
    float mean = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _mean_avx512 = _mm512_add_ps(_mean_avx512, _p);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _mean_avx = _mm256_add_ps(_mean_avx, _p);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _mean = _mm_add_ps(_mean, _p);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            mean += ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        _mean_avx512 = _mm512_div_ps(_mean_avx512, _elemcount);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        _mean_avx = _mm256_div_ps(_mean_avx, _elemcount);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__
        {
            __m128 _mean0 = _mm256_castps256_ps128(_mean_avx);
            __m128 _mean1 = _mm256_extractf128_ps(_mean_avx, 1);
            _mean = _mm_add_ps(_mean, _mean0);
            _mean = _mm_add_ps(_mean, _mean1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        _mean = _mm_div_ps(_mean, _elemcount);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        mean += _mm512_comp_reduce_add_ps(_mean_avx512);
#endif // __AVX512F__
        mean += _mm256_reduce_add_ps(_mean_avx);
#endif // __AVX__
        mean += _mm_reduce_add_ps(_mean);
#endif // __SSE2__

        mean = mean / elemcount;
#if __SSE2__
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _var_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _var_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _var = _mm_set1_ps(0.f);
#endif // __SSE2__
    float var = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _p = _mm512_sub_ps(_p, _mean_avx512);
            _var_avx512 = _mm512_fmadd_ps(_p, _p, _var_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _p = _mm256_sub_ps(_p, _mean_avx);
            _var_avx = _mm256_comp_fmadd_ps(_p, _p, _var_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _p = _mm_sub_ps(_p, _mean);
            _var = _mm_comp_fmadd_ps(_p, _p, _var);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = ptr0[0] - mean;
            var += v * v;
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);
        _var_avx512 = _mm512_div_ps(_var_avx512, _elemcount);
        _var_avx512 = _mm512_add_ps(_var_avx512, _eps);
        __m256 _var0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 0));
        __m256 _var1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 1));
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var0), _var1, 1);
        _mean_avx512 = _mm512_mul_ps(_mean_avx512, _var_avx512);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);
        _var_avx = _mm256_div_ps(_var_avx, _elemcount);
        _var_avx = _mm256_add_ps(_var_avx, _eps);
        _var_avx = _mm256_rsqrt_ps(_var_avx);
        _mean_avx = _mm256_mul_ps(_mean_avx, _var_avx);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__
        {
            __m128 _var0 = _mm256_castps256_ps128(_var_avx);
            __m128 _var1 = _mm256_extractf128_ps(_var_avx, 1);
            _var = _mm_add_ps(_var, _var0);
            _var = _mm_add_ps(_var, _var1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);
        _var = _mm_div_ps(_var, _elemcount);
        _var = _mm_add_ps(_var, _eps);
        _var = _mm_rsqrt_ps(_var);
        _mean = _mm_mul_ps(_mean, _var);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        var += _mm512_comp_reduce_add_ps(_var_avx512);
#endif // __AVX512F__
        var += _mm256_reduce_add_ps(_var_avx);
#endif // __AVX__
        var += _mm_reduce_add_ps(_var);
#endif // __SSE2__

        var = 1.f / sqrtf(var / elemcount + eps);
        mean = mean * var;
#if __SSE2__
        _var = _mm_set1_ps(var);
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr && beta_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                __m512 _beta = _mm512_set1_ps(beta_ptr[0]);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                __m256 _beta0 = _mm256_set1_ps(beta_ptr[0]);
                __m256 _beta1 = _mm256_set1_ps(beta_ptr[1]);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta0), _beta1, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _beta = _mm256_set1_ps(beta_ptr[0]);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m128 _beta2 = _mm_set1_ps(beta_ptr[2]);
                __m128 _beta3 = _mm_set1_ps(beta_ptr[3]);
                __m256 _beta01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                __m256 _beta23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta2), _beta3, 1);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta01), _beta23, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m256 _beta = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                __m128 _beta = _mm_set1_ps(beta_ptr[0]);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                __m512 _beta = _mm512_loadu_ps(beta_ptr);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
                beta_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                __m256 _beta = _mm256_loadu_ps(beta_ptr);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
                beta_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                __m128 _beta = _mm_loadu_ps(beta_ptr);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * var - mean) * gamma_ptr[0] + beta_ptr[0];
            ptr++;
            gamma_ptr++;
            beta_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_comp_fmsub_ps(_p, _var, _mean);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * var - mean;
            ptr++;
        }
    }
}